

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstalledFile.cxx
# Opt level: O3

void __thiscall cmInstalledFile::~cmInstalledFile(cmInstalledFile *this)

{
  cmCompiledGeneratorExpression *this_00;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->NameExpression;
  if (this_00 != (cmCompiledGeneratorExpression *)0x0) {
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression(this_00);
    operator_delete(this_00,0x180);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmInstalledFile::Property>_>_>
  ::~_Rb_tree(&(this->Properties)._M_t);
  pcVar1 = (this->Name)._M_dataplus._M_p;
  paVar2 = &(this->Name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

cmInstalledFile::~cmInstalledFile()
{
  if (NameExpression) {
    delete NameExpression;
  }
}